

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O3

int b_lshift(lua_State *L)

{
  lua_Unsigned lVar1;
  uint uVar2;
  lua_Integer lVar3;
  lua_Unsigned u;
  
  lVar1 = luaL_checkunsigned(L,1);
  lVar3 = luaL_checkinteger(L,2);
  uVar2 = (uint)lVar3;
  if ((int)uVar2 < 0) {
    u = 0;
    if (0xffffffe0 < uVar2) {
      u = lVar1 >> (-(byte)lVar3 & 0x1f);
    }
  }
  else {
    u = 0;
    if (uVar2 < 0x20) {
      u = lVar1 << ((byte)lVar3 & 0x1f);
    }
  }
  lua_pushunsigned(L,u);
  return 1;
}

Assistant:

static int b_lshift (lua_State *L) {
  return b_shift(L, luaL_checkunsigned(L, 1), luaL_checkint(L, 2));
}